

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::loadsummaryxref(summarycalc *this,string *filename)

{
  FILE *pFVar1;
  int iVar2;
  long lVar3;
  char *__filename;
  undefined8 uVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  value_type local_a4;
  int local_a0;
  int local_9c;
  int i;
  fmsummaryxref s;
  FILE *fin;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  string local_38 [8];
  string file;
  string *filename_local;
  summarycalc *this_local;
  
  std::__cxx11::string::string(local_38,(string *)filename);
  lVar3 = std::__cxx11::string::length();
  if (lVar3 != 0) {
    std::__cxx11::string::substr((ulong)local_78,(ulong)local_38);
    std::operator+(local_58,&this->inputpath_);
    std::__cxx11::string::operator=(local_38,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string(local_78);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  s._4_8_ = fopen(__filename,"rb");
  pFVar1 = _stderr;
  if ((FILE *)s._4_8_ == (FILE *)0x0) {
    uVar4 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"FATAL: %s: Error opening file %s\n","loadsummaryxref",uVar4);
    exit(-1);
  }
  init_o_to_s(this);
  sVar5 = fread(&local_9c,0xc,1,(FILE *)s._4_8_);
  local_a0 = (int)sVar5;
  while( true ) {
    pFVar1 = _stderr;
    if (local_a0 == 0) {
      fclose((FILE *)s._4_8_);
      std::__cxx11::string::~string(local_38);
      return;
    }
    if (9 < s.output_id) break;
    if (this->fout[s.output_id] != (FILE *)0x0) {
      if (i < this->min_summary_id_[s.output_id]) {
        this->min_summary_id_[s.output_id] = i;
      }
      if (this->max_summary_id_[s.output_id] < i) {
        this->max_summary_id_[s.output_id] = i;
      }
      sVar6 = std::vector<int,_std::allocator<int>_>::size(this->co_to_s_[s.output_id]);
      if (sVar6 < (ulong)(long)(local_9c + 1)) {
        local_a4 = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  (this->co_to_s_[s.output_id],(long)(local_9c + 1),&local_a4);
      }
      iVar2 = i;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->co_to_s_[s.output_id],(long)local_9c);
      *pvVar7 = iVar2;
    }
    sVar5 = fread(&local_9c,0xc,1,(FILE *)s._4_8_);
    local_a0 = (int)sVar5;
  }
  uVar4 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"FATAL: %s: Invalid summaryset id  %d found in %s\n","loadsummaryxref",
          (ulong)(uint)s.output_id,uVar4);
  exit(-1);
}

Assistant:

void summarycalc::loadsummaryxref(const std::string& filename)
{
	std::string file = filename;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__, file.c_str());
		::exit(-1);
	}

	init_o_to_s();

	fmsummaryxref s;
	int i = (int)fread(&s, sizeof(fmsummaryxref), 1, fin);
	while (i != 0) {
		if (s.summaryset_id > 9) {
			fprintf(stderr, "FATAL: %s: Invalid summaryset id  %d found in %s\n", __func__, s.summaryset_id, file.c_str());
			::exit(-1);
		}
		if (fout[s.summaryset_id] != nullptr) {
			if (s.summary_id < min_summary_id_[s.summaryset_id]) min_summary_id_[s.summaryset_id] = s.summary_id;
			if (s.summary_id > max_summary_id_[s.summaryset_id]) max_summary_id_[s.summaryset_id] = s.summary_id;
			if ( (*co_to_s_[s.summaryset_id]).size() < (size_t)(s.output_id + 1)) (*co_to_s_[s.summaryset_id]).resize(s.output_id + 1, 0);
			(*co_to_s_[s.summaryset_id])[s.output_id] = s.summary_id ;
		}
		i = (int) fread(&s, sizeof(fmsummaryxref), 1, fin);
	}

		fclose(fin);
}